

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonStrValMatchesRegexReq::JsonStrValMatchesRegexReq
          (JsonStrValMatchesRegexReq *this,regex *regex)

{
  JsonValKind local_24;
  type local_20;
  regex *local_18;
  regex *regex_local;
  JsonStrValMatchesRegexReq *this_local;
  
  local_24 = Str;
  local_18 = regex;
  regex_local = (regex *)this;
  boost::optional<yactfr::internal::JsonValKind>::optional
            ((optional<yactfr::internal::JsonValKind> *)&local_20,&local_24);
  JsonValReq::JsonValReq
            (&this->super_JsonValReq,(optional<yactfr::internal::JsonValKind>)local_20,false);
  (this->super_JsonValReq)._vptr_JsonValReq = (_func_int **)&PTR__JsonStrValMatchesRegexReq_007e0670
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&this->_regex,regex);
  return;
}

Assistant:

JsonStrValMatchesRegexReq::JsonStrValMatchesRegexReq(std::regex regex) :
    JsonValReq {JsonVal::Kind::Str},
    _regex {std::move(regex)}
{
}